

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::OutputRows
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,char *buffer,int strLen)

{
  FILE *__stream;
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  
  piVar2 = (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    if (piVar2 == (fileIDs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    iVar4 = 1;
    pcVar3 = buffer;
    while( true ) {
      uVar1 = fprintf((FILE *)this->fout_[*piVar2],"%s",pcVar3);
      __stream = _stderr;
      if ((int)uVar1 < 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(__stream,"FATAL: Error writing %s: %s\n",buffer,pcVar3);
        goto LAB_001098cf;
      }
      if (strLen - uVar1 == 0 || strLen < (int)uVar1) break;
      pcVar3 = pcVar3 + uVar1;
      fprintf(_stderr,"INFO: Attempt %d to write %s\n",iVar4,buffer);
      iVar4 = iVar4 + 1;
      strLen = strLen - uVar1;
      if (iVar4 == 0xb) {
        fprintf(_stderr,"FATAL: Maximum attempts to write %s exceeded\n",buffer);
LAB_001098cf:
        exit(1);
      }
    }
    piVar2 = piVar2 + 1;
  } while( true );
}

Assistant:

inline void aggreports::OutputRows(const std::vector<int> &fileIDs,
				   const char * buffer, int strLen) {

  for (std::vector<int>::const_iterator it = fileIDs.begin();
       it != fileIDs.end(); ++it) {

    const char * bufPtr = buffer;
    int num;
    int counter = 0;
    do {

      num = fprintf(fout_[*it], "%s", bufPtr);
      if (num < 0) {   // Write error
	fprintf(stderr, "FATAL: Error writing %s: %s\n",
		buffer, strerror(errno));
	exit(EXIT_FAILURE);
      } else if (num < strLen) {   // Incomplete write
	bufPtr += num;
	strLen -= num;
      } else break;   // Success

      fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter, buffer);

      if (counter == 10) {
	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);
      }

    } while (true);

  }

}